

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

void start_server(uv_loop_t *loop,uv_tcp_t *handle)

{
  uv_loop_t *puVar1;
  int iVar2;
  int iVar3;
  undefined8 *extraout_RDX;
  uv_loop_t *puVar4;
  uv_tcp_t *puVar5;
  uv_tcp_t *puVar6;
  long *plVar7;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  long lStack_b0;
  long lStack_a8;
  uv_loop_t *puStack_a0;
  undefined1 auStack_98 [16];
  undefined8 uStack_88;
  undefined1 auStack_80 [16];
  uv__queue *puStack_70;
  undefined1 auStack_68 [16];
  uv__queue *puStack_58;
  undefined1 auStack_50 [56];
  undefined1 local_18 [16];
  
  auStack_50._32_8_ = (uv__queue *)0x1c8c73;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,local_18);
  auStack_50._48_8_ = SEXT48(iVar2);
  auStack_50._40_8_ = (uv_connect_t *)0x0;
  if ((uv_shutdown_t *)auStack_50._48_8_ == (uv_shutdown_t *)0x0) {
    auStack_50._32_8_ = (uv__queue *)0x1c8ca0;
    iVar2 = uv_tcp_init(loop,&tcp_server);
    auStack_50._48_8_ = SEXT48(iVar2);
    auStack_50._40_8_ = (uv_connect_t *)0x0;
    if ((uv_shutdown_t *)auStack_50._48_8_ != (uv_shutdown_t *)0x0) goto LAB_001c8d2c;
    auStack_50._32_8_ = (uv__queue *)0x1c8ccd;
    iVar2 = uv_tcp_bind(&tcp_server,local_18,0);
    auStack_50._48_8_ = SEXT48(iVar2);
    auStack_50._40_8_ = (uv_connect_t *)0x0;
    if ((uv_shutdown_t *)auStack_50._48_8_ != (uv_shutdown_t *)0x0) goto LAB_001c8d39;
    auStack_50._32_8_ = (uv__queue *)0x1c8cff;
    iVar2 = uv_listen(&tcp_server,0x80,connection_cb);
    auStack_50._48_8_ = SEXT48(iVar2);
    auStack_50._40_8_ = (uv_connect_t *)0x0;
    if ((uv_shutdown_t *)auStack_50._48_8_ == (uv_shutdown_t *)0x0) {
      return;
    }
  }
  else {
    auStack_50._32_8_ = (uv__queue *)0x1c8d2c;
    start_server_cold_1();
LAB_001c8d2c:
    auStack_50._32_8_ = (uv__queue *)0x1c8d39;
    start_server_cold_2();
LAB_001c8d39:
    auStack_50._32_8_ = (uv__queue *)0x1c8d46;
    start_server_cold_3();
  }
  puVar4 = (uv_loop_t *)(auStack_50 + 0x30);
  auStack_50._32_8_ = do_connect;
  start_server_cold_4();
  puVar5 = (uv_tcp_t *)auStack_50;
  puStack_58 = (uv__queue *)0x1c8d71;
  auStack_50._32_8_ = loop;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_50 + 0x10);
  auStack_50._8_8_ = SEXT48(iVar2);
  auStack_50._0_8_ = (uv_handle_t *)0x0;
  if ((uv_loop_t *)auStack_50._8_8_ == (uv_loop_t *)0x0) {
    puStack_58 = (uv__queue *)0x1c8d9a;
    iVar2 = uv_tcp_init(puVar4,&tcp_client);
    auStack_50._8_8_ = SEXT48(iVar2);
    auStack_50._0_8_ = (uv_handle_t *)0x0;
    if ((uv_loop_t *)auStack_50._8_8_ != (uv_loop_t *)0x0) goto LAB_001c8e00;
    puStack_58 = (uv__queue *)0x1c8dd3;
    iVar2 = uv_tcp_connect(&connect_req,&tcp_client,auStack_50 + 0x10,connect_cb);
    auStack_50._8_8_ = SEXT48(iVar2);
    auStack_50._0_8_ = (uv_handle_t *)0x0;
    if ((uv_loop_t *)auStack_50._8_8_ == (uv_loop_t *)0x0) {
      return;
    }
  }
  else {
    puStack_58 = (uv__queue *)0x1c8e00;
    do_connect_cold_1();
LAB_001c8e00:
    puStack_58 = (uv__queue *)0x1c8e0d;
    do_connect_cold_2();
  }
  puStack_58 = (uv__queue *)run_test_tcp_close_reset_client_after_shutdown;
  do_connect_cold_3();
  puVar6 = (uv_tcp_t *)auStack_68;
  puStack_70 = (uv__queue *)0x1c8e24;
  puStack_58 = (uv__queue *)puVar4;
  ::loop = (uv_loop_t *)uv_default_loop();
  puStack_70 = (uv__queue *)0x1c8e33;
  start_server(::loop,puVar5);
  client_close = 1;
  shutdown_before_close = 1;
  puStack_70 = (uv__queue *)0x1c8e50;
  do_connect(::loop,puVar5);
  auStack_68._8_8_ = SEXT48(write_cb_called);
  auStack_68._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_68._8_8_ == (uv_loop_t *)0x0) {
    auStack_68._8_8_ = SEXT48(close_cb_called);
    auStack_68._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_68._8_8_ != (uv_loop_t *)0x0) goto LAB_001c8fb0;
    auStack_68._8_8_ = SEXT48(shutdown_cb_called);
    auStack_68._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_68._8_8_ != (uv_loop_t *)0x0) goto LAB_001c8fbd;
    puStack_70 = (uv__queue *)0x1c8ec7;
    iVar2 = uv_run(::loop,0);
    puVar1 = ::loop;
    auStack_68._8_8_ = SEXT48(iVar2);
    auStack_68._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_68._8_8_ != (uv_loop_t *)0x0) goto LAB_001c8fca;
    auStack_68._8_8_ = (uv_loop_t *)0x4;
    auStack_68._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_68._0_8_ != (uv_loop_t *)0x4) goto LAB_001c8fd7;
    auStack_68._8_8_ = SEXT48(close_cb_called);
    auStack_68._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_68._8_8_ != (uv_loop_t *)0x0) goto LAB_001c8fe4;
    auStack_68._8_8_ = (uv_loop_t *)0x1;
    auStack_68._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_68._0_8_ != (uv_loop_t *)0x1) goto LAB_001c8ff1;
    puStack_70 = (uv__queue *)0x1c8f66;
    uv_walk(::loop,close_walk_cb,0);
    puStack_70 = (uv__queue *)0x1c8f70;
    uv_run(puVar1,0);
    auStack_68._8_8_ = (uv_loop_t *)0x0;
    puStack_70 = (uv__queue *)0x1c8f85;
    iVar2 = uv_loop_close(::loop);
    auStack_68._0_8_ = SEXT48(iVar2);
    puVar4 = puVar1;
    if (auStack_68._8_8_ == auStack_68._0_8_) {
      puStack_70 = (uv__queue *)0x1c8f9b;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_70 = (uv__queue *)0x1c8fb0;
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_001c8fb0:
    puStack_70 = (uv__queue *)0x1c8fbd;
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_001c8fbd:
    puStack_70 = (uv__queue *)0x1c8fca;
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_001c8fca:
    puStack_70 = (uv__queue *)0x1c8fd7;
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_001c8fd7:
    puStack_70 = (uv__queue *)0x1c8fe4;
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_001c8fe4:
    puStack_70 = (uv__queue *)0x1c8ff1;
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_001c8ff1:
    puStack_70 = (uv__queue *)0x1c8ffe;
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  puStack_70 = (uv__queue *)run_test_tcp_close_reset_accepted;
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  puVar5 = (uv_tcp_t *)auStack_80;
  uStack_88._0_4_ = 0x1c9015;
  uStack_88._4_4_ = 0;
  puStack_70 = (uv__queue *)puVar4;
  ::loop = (uv_loop_t *)uv_default_loop();
  uStack_88._0_4_ = 0x1c9024;
  uStack_88._4_4_ = 0;
  start_server(::loop,puVar6);
  client_close = 0;
  shutdown_before_close = 0;
  uStack_88._0_4_ = 0x1c9041;
  uStack_88._4_4_ = 0;
  do_connect(::loop,puVar6);
  auStack_80._8_8_ = SEXT48(write_cb_called);
  auStack_80._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_80._8_8_ == (uv_loop_t *)0x0) {
    auStack_80._8_8_ = SEXT48(close_cb_called);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c91a1;
    auStack_80._8_8_ = SEXT48(shutdown_cb_called);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c91ae;
    uStack_88._0_4_ = 0x1c90b8;
    uStack_88._4_4_ = 0;
    iVar2 = uv_run(::loop,0);
    puVar1 = ::loop;
    auStack_80._8_8_ = SEXT48(iVar2);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c91bb;
    auStack_80._8_8_ = (uv_loop_t *)0x4;
    auStack_80._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_80._0_8_ != (uv_loop_t *)0x4) goto LAB_001c91c8;
    auStack_80._8_8_ = (uv_loop_t *)0x1;
    auStack_80._0_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_80._0_8_ != (uv_loop_t *)0x1) goto LAB_001c91d5;
    auStack_80._8_8_ = SEXT48(shutdown_cb_called);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c91e2;
    uStack_88._0_4_ = 0x1c9157;
    uStack_88._4_4_ = 0;
    uv_walk(::loop,close_walk_cb,0);
    uStack_88._0_4_ = 0x1c9161;
    uStack_88._4_4_ = 0;
    uv_run(puVar1,0);
    auStack_80._8_8_ = (uv_loop_t *)0x0;
    uStack_88._0_4_ = 0x1c9176;
    uStack_88._4_4_ = 0;
    iVar2 = uv_loop_close(::loop);
    auStack_80._0_8_ = SEXT48(iVar2);
    puVar4 = puVar1;
    if (auStack_80._8_8_ == auStack_80._0_8_) {
      uStack_88._0_4_ = 0x1c918c;
      uStack_88._4_4_ = 0;
      uv_library_shutdown();
      return;
    }
  }
  else {
    uStack_88._0_4_ = 0x1c91a1;
    uStack_88._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_1();
LAB_001c91a1:
    uStack_88._0_4_ = 0x1c91ae;
    uStack_88._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_2();
LAB_001c91ae:
    uStack_88._0_4_ = 0x1c91bb;
    uStack_88._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_3();
LAB_001c91bb:
    uStack_88._0_4_ = 0x1c91c8;
    uStack_88._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_4();
LAB_001c91c8:
    uStack_88._0_4_ = 0x1c91d5;
    uStack_88._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_5();
LAB_001c91d5:
    uStack_88._0_4_ = 0x1c91e2;
    uStack_88._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_6();
LAB_001c91e2:
    uStack_88._0_4_ = 0x1c91ef;
    uStack_88._4_4_ = 0;
    run_test_tcp_close_reset_accepted_cold_7();
  }
  uStack_88 = run_test_tcp_close_reset_accepted_after_shutdown;
  run_test_tcp_close_reset_accepted_cold_8();
  puVar6 = (uv_tcp_t *)auStack_98;
  puStack_a0 = (uv_loop_t *)0x1c9206;
  uStack_88 = (code *)puVar4;
  ::loop = (uv_loop_t *)uv_default_loop();
  puStack_a0 = (uv_loop_t *)0x1c9215;
  start_server(::loop,puVar5);
  client_close = 0;
  shutdown_before_close = 1;
  puStack_a0 = (uv_loop_t *)0x1c9232;
  do_connect(::loop,puVar5);
  auStack_98._8_8_ = SEXT48(write_cb_called);
  auStack_98._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_98._8_8_ == (uv_loop_t *)0x0) {
    auStack_98._8_8_ = SEXT48(close_cb_called);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c9392;
    auStack_98._8_8_ = SEXT48(shutdown_cb_called);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c939f;
    puStack_a0 = (uv_loop_t *)0x1c92a9;
    iVar2 = uv_run(::loop,0);
    puVar1 = ::loop;
    auStack_98._8_8_ = SEXT48(iVar2);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c93ac;
    auStack_98._8_8_ = (uv_loop_t *)0x4;
    auStack_98._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_98._0_8_ != (uv_loop_t *)0x4) goto LAB_001c93b9;
    auStack_98._8_8_ = SEXT48(close_cb_called);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c93c6;
    auStack_98._8_8_ = (uv_loop_t *)0x1;
    auStack_98._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_98._0_8_ != (uv_loop_t *)0x1) goto LAB_001c93d3;
    puStack_a0 = (uv_loop_t *)0x1c9348;
    uv_walk(::loop,close_walk_cb,0);
    puStack_a0 = (uv_loop_t *)0x1c9352;
    uv_run(puVar1,0);
    auStack_98._8_8_ = (uv_loop_t *)0x0;
    puStack_a0 = (uv_loop_t *)0x1c9367;
    iVar2 = uv_loop_close(::loop);
    auStack_98._0_8_ = SEXT48(iVar2);
    puVar4 = puVar1;
    if (auStack_98._8_8_ == auStack_98._0_8_) {
      puStack_a0 = (uv_loop_t *)0x1c937d;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_a0 = (uv_loop_t *)0x1c9392;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_001c9392:
    puStack_a0 = (uv_loop_t *)0x1c939f;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_001c939f:
    puStack_a0 = (uv_loop_t *)0x1c93ac;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_001c93ac:
    puStack_a0 = (uv_loop_t *)0x1c93b9;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_001c93b9:
    puStack_a0 = (uv_loop_t *)0x1c93c6;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_001c93c6:
    puStack_a0 = (uv_loop_t *)0x1c93d3;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_001c93d3:
    puStack_a0 = (uv_loop_t *)0x1c93e0;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  puStack_a0 = (uv_loop_t *)run_test_tcp_close_reset_accepted_after_socket_shutdown;
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  iVar2 = (int)&lStack_b0;
  puStack_a0 = puVar4;
  ::loop = (uv_loop_t *)uv_default_loop();
  start_server(::loop,puVar6);
  client_close = 0;
  shutdown_before_close = 2;
  do_connect(::loop,puVar6);
  lStack_a8 = (long)write_cb_called;
  lStack_b0 = 0;
  if (lStack_a8 == 0) {
    lStack_a8 = (long)close_cb_called;
    lStack_b0 = 0;
    if (lStack_a8 != 0) goto LAB_001c9583;
    lStack_a8 = (long)shutdown_cb_called;
    lStack_b0 = 0;
    if (lStack_a8 != 0) goto LAB_001c9590;
    iVar3 = uv_run(::loop,0);
    puVar4 = ::loop;
    lStack_a8 = (long)iVar3;
    lStack_b0 = 0;
    if (lStack_a8 != 0) goto LAB_001c959d;
    lStack_a8 = 4;
    lStack_b0 = (long)write_cb_called;
    if (lStack_b0 != 4) goto LAB_001c95aa;
    lStack_a8 = 1;
    lStack_b0 = (long)close_cb_called;
    if (lStack_b0 != 1) goto LAB_001c95b7;
    lStack_a8 = (long)shutdown_cb_called;
    lStack_b0 = 0;
    if (lStack_a8 != 0) goto LAB_001c95c4;
    uv_walk(::loop,close_walk_cb,0);
    uv_run(puVar4,0);
    lStack_a8 = 0;
    iVar3 = uv_loop_close(::loop);
    lStack_b0 = (long)iVar3;
    if (lStack_a8 == lStack_b0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_1();
LAB_001c9583:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_2();
LAB_001c9590:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_3();
LAB_001c959d:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_4();
LAB_001c95aa:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_5();
LAB_001c95b7:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_6();
LAB_001c95c4:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_7();
  }
  plVar7 = &lStack_a8;
  run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(::loop,&tcp_accepted);
    if (iVar2 == 0) {
      iVar2 = uv_accept(plVar7,&tcp_accepted);
      if (iVar2 == 0) {
        uv_read_start(&tcp_accepted,alloc_cb,read_cb);
        return;
      }
      goto LAB_001c9690;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_001c9690:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return;
}

Assistant:

static void start_server(uv_loop_t* loop, uv_tcp_t* handle) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, handle);
  ASSERT_OK(r);

  r = uv_tcp_bind(handle, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)handle, 128, connection_cb);
  ASSERT_OK(r);
}